

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O1

_compatible_texture_target_pairs *
gl4cts::TextureViewUtilities::getLegalTextureAndViewTargetCombinations(void)

{
  GLenum original_texture_target;
  GLenum view_texture_target;
  bool bVar1;
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  *in_RDI;
  long lVar2;
  pair<unsigned_int,_unsigned_int> local_40;
  long local_38;
  
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  local_38 = 0;
  do {
    original_texture_target = (&valid_texture_targets)[local_38];
    lVar2 = 0;
    do {
      view_texture_target = *(GLenum *)((long)&valid_texture_targets + lVar2);
      bVar1 = isLegalTextureTargetForTextureView(original_texture_target,view_texture_target);
      if (bVar1) {
        local_40.first = original_texture_target;
        local_40.second = view_texture_target;
        std::
        vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
        ::emplace_back<std::pair<unsigned_int,unsigned_int>>(in_RDI,&local_40);
      }
      lVar2 = lVar2 + 4;
    } while (lVar2 != 0x2c);
    local_38 = local_38 + 1;
  } while (local_38 != 0xb);
  return (_compatible_texture_target_pairs *)in_RDI;
}

Assistant:

TextureViewUtilities::_compatible_texture_target_pairs TextureViewUtilities::getLegalTextureAndViewTargetCombinations()
{
	_compatible_texture_target_pairs result;

	/* Iterate over all texture targets valid for a glTextureView() call. Consider each one of them as
	 * original texture target.
	 */
	for (unsigned int n_original_texture_target = 0; n_original_texture_target < n_valid_texture_targets;
		 ++n_original_texture_target)
	{
		const glw::GLenum original_texture_target = valid_texture_targets[n_original_texture_target];

		/* Iterate again, but this time consider each texture target as a valid new target */
		for (unsigned int n_compatible_texture_target = 0; n_compatible_texture_target < n_valid_texture_targets;
			 ++n_compatible_texture_target)
		{
			const glw::GLenum view_texture_target = valid_texture_targets[n_compatible_texture_target];

			if (TextureViewUtilities::isLegalTextureTargetForTextureView(original_texture_target, view_texture_target))
			{
				result.push_back(_texture_target_pair(original_texture_target, view_texture_target));
			}
		} /* for (all texture targets that are potentially compatible) */
	}	 /* for (all original texture targets) */

	return result;
}